

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexOrdering.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderVertexOrdering::verifyVertexOrderingCorrectness
          (TessellationShaderVertexOrdering *this,_test_iteration *test_iteration)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  _tessellation_shader_vertex_ordering _Var2;
  char *pcVar3;
  MessageBuilder *pMVar4;
  TestError *this_01;
  ulong uVar5;
  ulong uVar6;
  _tessellation_primitive_mode primitive_mode_00;
  _tessellation_shader_vertex_ordering vertex_ordering_00;
  ulong extraout_RDX;
  ulong uVar7;
  long lVar8;
  float *out_cartesian_coordinates;
  float fVar9;
  float cartesian_vertex_data [6];
  string vertex_ordering;
  string primitive_mode;
  float barycentric_vertex_data [9];
  
  uVar7 = 0;
  do {
    uVar6 = (ulong)test_iteration->n_vertices % 3;
    primitive_mode_00 = (_tessellation_primitive_mode)uVar6;
    if ((ulong)test_iteration->n_vertices / 3 <= uVar7) {
      return;
    }
    pcVar3 = test_iteration->data;
    uVar5 = (ulong)(uint)((int)uVar7 * 9);
    cartesian_vertex_data[0] = *(float *)(pcVar3 + uVar5 * 4);
    cartesian_vertex_data[1] = *(float *)(pcVar3 + uVar5 * 4 + 4);
    cartesian_vertex_data[2] = *(float *)(pcVar3 + uVar5 * 4 + 0xc);
    cartesian_vertex_data[3] = *(float *)(pcVar3 + uVar5 * 4 + 0x10);
    cartesian_vertex_data[4] = *(float *)(pcVar3 + uVar5 * 4 + 0x18);
    cartesian_vertex_data[5] = *(float *)(pcVar3 + uVar5 * 4 + 0x1c);
    if (test_iteration->primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) {
      barycentric_vertex_data[1] = *(float *)(pcVar3 + uVar5 * 4 + 4);
      barycentric_vertex_data[0] = *(float *)(pcVar3 + uVar5 * 4);
      barycentric_vertex_data[2] = *(float *)(pcVar3 + uVar5 * 4 + 8);
      barycentric_vertex_data[3] = *(float *)(pcVar3 + uVar5 * 4 + 0xc);
      barycentric_vertex_data[4] = *(float *)(pcVar3 + uVar5 * 4 + 0x10);
      barycentric_vertex_data[5] = *(float *)(pcVar3 + uVar5 * 4 + 0x14);
      barycentric_vertex_data[6] = *(float *)(pcVar3 + uVar5 * 4 + 0x18);
      barycentric_vertex_data[7] = *(float *)(pcVar3 + uVar5 * 4 + 0x1c);
      barycentric_vertex_data[8] = *(float *)(pcVar3 + uVar5 * 4 + 0x20);
      out_cartesian_coordinates = cartesian_vertex_data;
      for (lVar8 = 0; primitive_mode_00 = (_tessellation_primitive_mode)uVar6, lVar8 != 0x24;
          lVar8 = lVar8 + 0xc) {
        TessellationShaderUtils::convertBarycentricCoordinatesToCartesian
                  ((float *)((long)barycentric_vertex_data + lVar8),out_cartesian_coordinates);
        out_cartesian_coordinates = out_cartesian_coordinates + 2;
        uVar6 = extraout_RDX;
      }
    }
    fVar9 = 0.0;
    for (lVar8 = 1; lVar8 != 7; lVar8 = lVar8 + 2) {
      uVar6 = (ulong)((int)lVar8 + 1);
      if (lVar8 == 5) {
        uVar6 = 0;
      }
      fVar9 = fVar9 + (cartesian_vertex_data[lVar8 + -1] * cartesian_vertex_data[uVar6 + 1] -
                      cartesian_vertex_data[lVar8] * cartesian_vertex_data[uVar6]);
    }
    fVar9 = fVar9 * 0.5;
    _Var2 = test_iteration->vertex_ordering;
    if (_Var2 == TESSELLATION_SHADER_VERTEX_ORDERING_CCW) {
      if (fVar9 < 0.0) goto LAB_00cad4cb;
    }
    else if (((_Var2 == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT) && (fVar9 < 0.0)) ||
            ((_Var2 == TESSELLATION_SHADER_VERTEX_ORDERING_CW && (0.0 <= fVar9)))) {
LAB_00cad4cb:
      TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
                (&primitive_mode,(TessellationShaderUtils *)(ulong)test_iteration->primitive_mode,
                 primitive_mode_00);
      TessellationShaderUtils::getESTokenForVertexOrderingMode_abi_cxx11_
                (&vertex_ordering,(TessellationShaderUtils *)(ulong)test_iteration->vertex_ordering,
                 vertex_ordering_00);
      barycentric_vertex_data._0_8_ =
           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(barycentric_vertex_data + 2);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"For primitive mode: [");
      std::operator<<((ostream *)this_00,primitive_mode._M_dataplus._M_p);
      std::operator<<((ostream *)this_00,"] and inner tessellation levels: [");
      pMVar4 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)barycentric_vertex_data,
                          test_iteration->inner_tess_levels);
      std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,test_iteration->inner_tess_levels + 1);
      std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                      "] and outer tessellation levels: [");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,test_iteration->outer_tess_levels);
      std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,test_iteration->outer_tess_levels + 1);
      std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,test_iteration->outer_tess_levels + 2);
      std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,test_iteration->outer_tess_levels + 3);
      poVar1 = &pMVar4->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"] ");
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      "and vertex ordering: [");
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      vertex_ordering._M_dataplus._M_p);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      "] , vertex orientation has been found to be incompatible with the ordering requested."
                     );
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      if ((test_iteration->vertex_ordering & ~TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT) ==
          TESSELLATION_SHADER_VERTEX_ORDERING_CCW) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,
                   "Counter-clockwise ordering was expected but retrieved tessellation coordinates are laid out in clockwise order"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexOrdering.cpp"
                   ,0x28e);
      }
      else {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,
                   "Clockwise ordering was expected but retrieved tessellation coordinates are laid out in counter-clockwise order"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexOrdering.cpp"
                   ,0x293);
      }
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void TessellationShaderVertexOrdering::verifyVertexOrderingCorrectness(const _test_iteration& test_iteration)
{
	/* Sanity check */
	DE_ASSERT(test_iteration.primitive_mode != TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES);

	/* Iterate through all vertices */
	const float		   epsilon					= 1e-5f;
	const unsigned int n_vertices_per_primitive = 3;

	for (unsigned int n_primitive = 0; n_primitive < test_iteration.n_vertices / n_vertices_per_primitive;
		 ++n_primitive)
	{
		const float* primitive_data =
			(const float*)test_iteration.data + 3 /* components */ * n_primitive * n_vertices_per_primitive;
		const float* primitive_vertex1_data = primitive_data;
		const float* primitive_vertex2_data = primitive_vertex1_data + 3; /* components */
		const float* primitive_vertex3_data = primitive_vertex2_data + 3; /* components */

		float cartesian_vertex_data[6] = { primitive_vertex1_data[0], primitive_vertex1_data[1],
										   primitive_vertex2_data[0], primitive_vertex2_data[1],
										   primitive_vertex3_data[0], primitive_vertex3_data[1] };

		if (test_iteration.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES)
		{
			/* Triangles are described in barycentric coordinate. Convert to
			 * cartesian coordinates before we continue with actual test.
			 */
			const float barycentric_vertex_data[] = {
				primitive_vertex1_data[0], primitive_vertex1_data[1], primitive_vertex1_data[2],
				primitive_vertex2_data[0], primitive_vertex2_data[1], primitive_vertex2_data[2],
				primitive_vertex3_data[0], primitive_vertex3_data[1], primitive_vertex3_data[2],
			};

			/* Sanity checks .. */
			DE_UNREF(epsilon);
			DE_ASSERT(de::abs(barycentric_vertex_data[0] + barycentric_vertex_data[1] + barycentric_vertex_data[2] -
							  1.0f) < epsilon);
			DE_ASSERT(de::abs(barycentric_vertex_data[3] + barycentric_vertex_data[4] + barycentric_vertex_data[5] -
							  1.0f) < epsilon);
			DE_ASSERT(de::abs(barycentric_vertex_data[6] + barycentric_vertex_data[7] + barycentric_vertex_data[8] -
							  1.0f) < epsilon);

			for (unsigned int n_vertex = 0; n_vertex < 3; ++n_vertex)
			{
				TessellationShaderUtils::convertBarycentricCoordinatesToCartesian(
					barycentric_vertex_data + n_vertex * 3, cartesian_vertex_data + n_vertex * 2);
			}
		} /* if (test_iteration.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) */

		/* Compute result of eq 3.6.1 */
		float determinant = 0.0f;

		for (unsigned int n_vertex = 0; n_vertex < n_vertices_per_primitive; ++n_vertex)
		{
			int i_op_1 = (n_vertex + 1) % n_vertices_per_primitive;

			determinant += (cartesian_vertex_data[n_vertex * 2 /* components */ + 0] *
								cartesian_vertex_data[i_op_1 * 2 /* components */ + 1] -
							cartesian_vertex_data[i_op_1 * 2 /* components */ + 0] *
								cartesian_vertex_data[n_vertex * 2 /* components */ + 1]);
		} /* for (all vertices) */

		determinant *= 0.5f;

		/* Positive determinant implies counterclockwise ordering */
		if (((test_iteration.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CCW ||
			  test_iteration.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT) &&
			 determinant < 0.0f) ||
			(test_iteration.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CW && determinant >= 0.0f))
		{
			std::string primitive_mode =
				TessellationShaderUtils::getESTokenForPrimitiveMode(test_iteration.primitive_mode);
			std::string vertex_ordering =
				TessellationShaderUtils::getESTokenForVertexOrderingMode(test_iteration.vertex_ordering);

			m_testCtx.getLog() << tcu::TestLog::Message << "For primitive mode: [" << primitive_mode.c_str()
							   << "] "
								  "and inner tessellation levels:"
								  " ["
							   << test_iteration.inner_tess_levels[0] << ", " << test_iteration.inner_tess_levels[1]
							   << "] "
								  "and outer tessellation levels:"
								  " ["
							   << test_iteration.outer_tess_levels[0] << ", " << test_iteration.outer_tess_levels[1]
							   << ", " << test_iteration.outer_tess_levels[2] << ", "
							   << test_iteration.outer_tess_levels[3] << "] "
							   << "and vertex ordering: [" << vertex_ordering.c_str()
							   << "] "
								  ", vertex orientation has been found to be incompatible with the ordering requested."
							   << tcu::TestLog::EndMessage;

			if (test_iteration.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CCW ||
				test_iteration.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT)
			{
				TCU_FAIL("Counter-clockwise ordering was expected but retrieved tessellation coordinates are laid out "
						 "in clockwise order");
			}
			else
			{
				TCU_FAIL("Clockwise ordering was expected but retrieved tessellation coordinates are laid out in "
						 "counter-clockwise order");
			}
		}
	} /* for (all triangles) */
}